

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

int __thiscall
doctest::detail::MultiLaneAtomic<int>::operator=(MultiLaneAtomic<int> *this,int desired)

{
  long lVar1;
  int iVar2;
  
  iVar2 = desired;
  for (lVar1 = 0; lVar1 != 0x800; lVar1 = lVar1 + 0x40) {
    LOCK();
    *(int *)(this->m_atomics[0].padding + lVar1 + -4) = iVar2;
    UNLOCK();
    iVar2 = 0;
  }
  return desired;
}

Assistant:

T operator=(T desired) DOCTEST_NOEXCEPT { // lgtm [cpp/assignment-does-not-return-this]
            store(desired);
            return desired;
        }